

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SIBImporter.cpp
# Opt level: O2

void __thiscall
Assimp::SIBImporter::InternReadFile
          (SIBImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint32_t posB;
  uint32_t uVar3;
  pointer paVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  pointer ppaVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  uint i_2;
  int iVar22;
  uint uVar23;
  uint uVar24;
  undefined4 extraout_var;
  aiMaterial *this_00;
  SIBChunk SVar25;
  aiLight *this_01;
  SIBEdge *pSVar26;
  aiMatrix4x4t<float> *this_02;
  Logger *this_03;
  aiMesh *paVar27;
  ulong uVar28;
  ulong *puVar29;
  aiFace *paVar30;
  aiVector3D *paVar31;
  aiMaterial **__dest;
  aiMesh **__dest_00;
  aiLight **__dest_01;
  aiNode *this_04;
  aiNode **ppaVar32;
  aiNode *paVar33;
  uint *puVar34;
  aiMetadata *this_05;
  aiNode *paVar35;
  DeadlyImportError *pDVar36;
  aiLightSourceType aVar37;
  uint32_t uVar38;
  ulong uVar39;
  aiFace *paVar40;
  uint uVar41;
  size_t faceIdx_1;
  size_t __n;
  size_type sVar42;
  uint32_t *puVar43;
  pointer pSVar44;
  uint32_t uVar45;
  uint32_t uVar46;
  ulong uVar47;
  uint uVar48;
  size_type __n_00;
  uint pt;
  long lVar50;
  ulong uVar51;
  long lVar52;
  uint32_t uVar53;
  size_t faceIdx;
  pointer pTVar54;
  uint32_t uVar55;
  pointer pSVar56;
  bool bVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  aiVector3t<float> aVar63;
  StreamReaderLE stream;
  aiVector3t<float> local_f88;
  aiScene *local_f78;
  pointer local_f70;
  undefined8 local_f68;
  undefined8 uStack_f60;
  float shiny;
  float fStack_f54;
  float local_f50;
  ulong local_f48;
  aiMatrix4x4 *local_f40;
  ulong local_f38;
  pointer local_f30;
  uint local_f24;
  vector<TempMesh,_std::allocator<TempMesh>_> meshes;
  SIB sib;
  aiMaterial *defmtl;
  SIBChunk chunk;
  float fStack_e58;
  float fStack_e54;
  float local_e50;
  float local_e4c;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_e30;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_e18;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_e00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_de8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_dd0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_db8;
  pointer local_da0;
  pointer local_d98;
  _Rb_tree_node_base local_d80;
  size_t local_d60;
  aiMatrix4x4 worldToLocal;
  undefined1 local_cf0 [8];
  aiVector3D uv;
  aiMatrix4x4 worldToLocalN;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> faceNormals;
  aiMatrix4x4 local_88c;
  size_t local_848;
  size_t local_840;
  aiLight *light;
  float local_830;
  float local_82c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_828;
  float local_818;
  float local_814;
  float local_810;
  float local_80c;
  float local_808;
  float local_804;
  float local_800;
  float local_7fc;
  aiString defname;
  SIBChunk *pSVar49;
  
  local_f78 = pScene;
  std::__cxx11::string::string((string *)&faceNormals,"rb",(allocator *)&light);
  iVar22 = (*pIOHandler->_vptr_IOSystem[4])
                     (pIOHandler,(pFile->_M_dataplus)._M_p,
                      faceNormals.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start);
  StreamReader<false,_false>::StreamReader(&stream,(IOStream *)CONCAT44(extraout_var,iVar22),false);
  std::__cxx11::string::~string((string *)&faceNormals);
  if (((int)stream.end - (int)stream.current & 0xfffffff0U) == 0) {
    pDVar36 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&faceNormals
                   ,"SIB file is either empty or corrupt: ",pFile);
    DeadlyImportError::DeadlyImportError(pDVar36,(string *)&faceNormals);
    __cxa_throw(pDVar36,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  sib.insts.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sib.insts.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sib.objs.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  sib.objs.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  sib.lights.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sib.objs.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  sib.lights.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sib.lights.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sib.meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  sib.meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  sib.mtls.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sib.meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  sib.mtls.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sib.mtls.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sib.insts.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(this_00);
  defmtl = this_00;
  std::__cxx11::string::string((string *)&faceNormals,"DefaultMaterial",(allocator *)&light);
  __n = 0x3ff;
  if (((ulong)faceNormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
              ._M_impl.super__Vector_impl_data._M_finish & 0xfffffc00) == 0) {
    __n = (ulong)faceNormals.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish & 0xffffffff;
  }
  defname.length = (ai_uint32)__n;
  memcpy(defname.data,
         faceNormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
         _M_impl.super__Vector_impl_data._M_start,__n);
  defname.data[__n] = '\0';
  std::__cxx11::string::~string((string *)&faceNormals);
  aiMaterial::AddProperty(defmtl,&defname,"?mat.name",0,0);
  std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::push_back(&sib.mtls,&defmtl);
  local_f40 = &local_88c;
  do {
    if (((int)stream.limit - (int)stream.current & 0xfffffff8U) == 0) {
      lVar50 = (long)sib.objs.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)sib.objs.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
                     super__Vector_impl_data._M_start;
      std::vector<SIBObject,std::allocator<SIBObject>>::
      insert<__gnu_cxx::__normal_iterator<SIBObject*,std::vector<SIBObject,std::allocator<SIBObject>>>,void>
                ((vector<SIBObject,std::allocator<SIBObject>> *)&sib.objs,
                 (const_iterator)
                 sib.objs.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<SIBObject_*,_std::vector<SIBObject,_std::allocator<SIBObject>_>_>
                  )sib.insts.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
                   super__Vector_impl_data._M_start,
                 (__normal_iterator<SIBObject_*,_std::vector<SIBObject,_std::allocator<SIBObject>_>_>
                  )sib.insts.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
                   super__Vector_impl_data._M_finish);
      if (sib.insts.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          sib.insts.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
          super__Vector_impl_data._M_start) {
        sib.insts.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
        super__Vector_impl_data._M_finish =
             sib.insts.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
      local_f70 = sib.mtls.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      uVar28 = (long)sib.mtls.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)sib.mtls.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      uVar24 = (uint)(uVar28 >> 3);
      local_f78->mNumMaterials = uVar24;
      local_f30 = sib.meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      uVar51 = (long)sib.meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)sib.meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
      uVar23 = (uint)(uVar51 >> 3);
      local_f78->mNumMeshes = uVar23;
      local_f68 = sib.lights.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      uVar39 = (long)sib.lights.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)sib.lights.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
      uVar48 = (uint)(uVar39 >> 3);
      local_f78->mNumLights = uVar48;
      if (uVar24 == 0) {
        __dest = (aiMaterial **)0x0;
      }
      else {
        __dest = (aiMaterial **)operator_new__(uVar28 & 0x7fffffff8);
      }
      local_f78->mMaterials = __dest;
      if (uVar23 == 0) {
        __dest_00 = (aiMesh **)0x0;
      }
      else {
        __dest_00 = (aiMesh **)operator_new__(uVar51 & 0x7fffffff8);
      }
      local_f78->mMeshes = __dest_00;
      if (uVar48 == 0) {
        __dest_01 = (aiLight **)0x0;
      }
      else {
        local_f38 = uVar39;
        __dest_01 = (aiLight **)operator_new__(uVar39 & 0x7fffffff8);
        uVar39 = local_f38;
      }
      local_f78->mLights = __dest_01;
      if (uVar24 != 0) {
        memcpy(__dest,local_f70,uVar28 & 0x7fffffff8);
      }
      if (uVar23 != 0) {
        memcpy(__dest_00,local_f30,uVar51 & 0x7fffffff8);
      }
      if (uVar48 != 0) {
        memcpy(__dest_01,local_f68,uVar39 & 0x7fffffff8);
      }
      this_04 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(this_04);
      aiString::Set((aiString *)this_04,"<SIBRoot>");
      pSVar56 = sib.objs.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
                super__Vector_impl_data._M_finish;
      pSVar44 = sib.objs.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar52 = ((long)sib.lights.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)sib.lights.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) +
               ((long)sib.objs.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)sib.objs.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
                     super__Vector_impl_data._M_start) / 0x458;
      uVar48 = (uint)lVar52;
      this_04->mNumChildren = uVar48;
      if (uVar48 == 0) {
        ppaVar32 = (aiNode **)0x0;
      }
      else {
        ppaVar32 = (aiNode **)operator_new__(lVar52 * 8 & 0x7fffffff8);
      }
      this_04->mChildren = ppaVar32;
      local_f78->mRootNode = this_04;
      uVar39 = 0;
      while( true ) {
        if ((ulong)(((long)pSVar56 - (long)pSVar44) / 0x458) <= uVar39) {
          uVar51 = 0;
          while( true ) {
            if ((ulong)((long)sib.lights.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)sib.lights.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 3) <= uVar51) {
              SIB::~SIB(&sib);
              StreamReader<false,_false>::~StreamReader(&stream);
              return;
            }
            if (this_04->mChildren == (aiNode **)0x0) break;
            paVar33 = (aiNode *)
                      sib.lights.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar51];
            if (paVar33 != (aiNode *)0x0) {
              paVar35 = (aiNode *)operator_new(0x478);
              aiNode::aiNode(paVar35);
              this_04->mChildren[uVar39] = paVar35;
              if (paVar35 != paVar33) {
                uVar48 = (paVar33->mName).length;
                (paVar35->mName).length = uVar48;
                memcpy((paVar35->mName).data,(paVar33->mName).data,(ulong)uVar48);
                (paVar35->mName).data[uVar48] = '\0';
              }
              uVar39 = uVar39 + 1;
              paVar35->mParent = this_04;
            }
            uVar51 = uVar51 + 1;
          }
          __assert_fail("root->mChildren",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/SIB/SIBImporter.cpp"
                        ,0x3a7,
                        "virtual void Assimp::SIBImporter::InternReadFile(const std::string &, aiScene *, IOSystem *)"
                       );
        }
        if (this_04->mChildren == (aiNode **)0x0) break;
        paVar33 = (aiNode *)operator_new(0x478);
        aiNode::aiNode(paVar33);
        paVar35 = (aiNode *)(pSVar44 + uVar39);
        this_04->mChildren[uVar39] = paVar33;
        if (paVar33 != paVar35) {
          uVar48 = (paVar35->mName).length;
          (paVar33->mName).length = uVar48;
          memcpy((paVar33->mName).data,(paVar35->mName).data,(ulong)uVar48);
          (paVar33->mName).data[uVar48] = '\0';
        }
        paVar33->mParent = this_04;
        fVar58 = (paVar35->mTransformation).a2;
        fVar61 = (paVar35->mTransformation).a3;
        fVar62 = (paVar35->mTransformation).a4;
        fVar59 = (paVar35->mTransformation).b1;
        fVar60 = (paVar35->mTransformation).b2;
        fVar12 = (paVar35->mTransformation).b3;
        fVar13 = (paVar35->mTransformation).b4;
        fVar14 = (paVar35->mTransformation).c1;
        fVar15 = (paVar35->mTransformation).c2;
        fVar16 = (paVar35->mTransformation).c3;
        fVar17 = (paVar35->mTransformation).c4;
        fVar18 = (paVar35->mTransformation).d1;
        fVar19 = (paVar35->mTransformation).d2;
        fVar20 = (paVar35->mTransformation).d3;
        fVar21 = (paVar35->mTransformation).d4;
        (paVar33->mTransformation).a1 = (paVar35->mTransformation).a1;
        (paVar33->mTransformation).a2 = fVar58;
        (paVar33->mTransformation).a3 = fVar61;
        (paVar33->mTransformation).a4 = fVar62;
        (paVar33->mTransformation).b1 = fVar59;
        (paVar33->mTransformation).b2 = fVar60;
        (paVar33->mTransformation).b3 = fVar12;
        (paVar33->mTransformation).b4 = fVar13;
        (paVar33->mTransformation).c1 = fVar14;
        (paVar33->mTransformation).c2 = fVar15;
        (paVar33->mTransformation).c3 = fVar16;
        (paVar33->mTransformation).c4 = fVar17;
        (paVar33->mTransformation).d1 = fVar18;
        (paVar33->mTransformation).d2 = fVar19;
        (paVar33->mTransformation).d3 = fVar20;
        (paVar33->mTransformation).d4 = fVar21;
        uVar51 = *(ulong *)&paVar35->mNumChildren;
        paVar33->mNumMeshes = (uint)uVar51;
        if ((uint)uVar51 == 0) {
          puVar34 = (uint *)0x0;
        }
        else {
          puVar34 = (uint *)operator_new__((uVar51 & 0xffffffff) << 2);
        }
        uVar28 = uVar39 + 1;
        paVar33->mMeshes = puVar34;
        for (uVar47 = 0; uVar47 < (uVar51 & 0xffffffff); uVar47 = uVar47 + 1) {
          paVar33->mMeshes[uVar47] = *(int *)&paVar35->mParent + (int)uVar47;
          uVar51 = (ulong)paVar33->mNumMeshes;
        }
        bVar57 = (ulong)(lVar50 / 0x458) <= uVar39;
        pSVar44 = sib.objs.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar39 = uVar28;
        pSVar56 = sib.objs.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (bVar57) {
          this_05 = aiMetadata::Alloc(1);
          paVar33->mMetaData = this_05;
          std::__cxx11::string::string((string *)&faceNormals,"IsInstance",(allocator *)&light);
          chunk.Tag = CONCAT31(chunk.Tag._1_3_,1);
          aiMetadata::Set<bool>(this_05,0,(string *)&faceNormals,(bool *)&chunk);
          std::__cxx11::string::~string((string *)&faceNormals);
          pSVar44 = sib.objs.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pSVar56 = sib.objs.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        }
      }
      __assert_fail("root->mChildren",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/SIB/SIBImporter.cpp"
                    ,0x38e,
                    "virtual void Assimp::SIBImporter::InternReadFile(const std::string &, aiScene *, IOSystem *)"
                   );
    }
    SVar25 = ReadChunk(&stream);
    uVar48 = SVar25.Size + ((int)stream.current - (int)stream.buffer);
    pSVar49 = (SIBChunk *)(ulong)uVar48;
    local_cf0 = (undefined1  [8])SVar25;
    local_f24 = StreamReader<false,_false>::SetReadLimit(&stream,uVar48);
    uVar55 = SVar25.Tag;
    if ((uVar55 != 0x47525053) && (uVar55 != 0x54455850)) {
      if (uVar55 == 0x494e5354) {
        faceNormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)((ulong)faceNormals.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start & 0xffffff0000000000);
        memset((void *)((long)&faceNormals.
                               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + 5),0x1b,0x3ff);
        local_88c.a1 = 1.0;
        local_88c.a2 = 0.0;
        local_88c.a3 = 0.0;
        local_88c.a4 = 0.0;
        local_88c.b1 = 0.0;
        local_88c.b2 = 1.0;
        local_88c.b3 = 0.0;
        local_88c.b4 = 0.0;
        local_88c.c1 = 0.0;
        local_88c.c2 = 0.0;
        local_88c.c3 = 1.0;
        local_88c.c4 = 0.0;
        local_88c.d1 = 0.0;
        local_88c.d2 = 0.0;
        local_88c.d3 = 0.0;
        local_88c.d4 = 1.0;
        uVar39 = 0;
        while (((int)stream.limit - (int)stream.current & 0xfffffff8U) != 0) {
          SVar25 = ReadChunk(&stream);
          uVar48 = ((int)stream.current - (int)stream.buffer) + SVar25.Size;
          pSVar49 = (SIBChunk *)(ulong)uVar48;
          worldToLocal._0_8_ = SVar25;
          uVar48 = StreamReader<false,_false>::SetReadLimit(&stream,uVar48);
          uVar55 = SVar25.Tag;
          if (uVar55 == 0x534e414d) {
            ReadString((aiString *)&light,&stream,SVar25.Size >> 1);
            uVar51 = (ulong)light & 0xffffffff;
            faceNormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(faceNormals.
                                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start._4_4_,(uint)light);
            memcpy((void *)((long)&faceNormals.
                                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 4),
                   (void *)((long)&light + 4),uVar51);
            *(undefined1 *)
             ((long)&faceNormals.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start + uVar51 + 4) = 0;
          }
          else if (uVar55 != 0x44494e46) {
            if (uVar55 == 0x494e5349) {
              uVar23 = StreamReader<false,_false>::Get<unsigned_int>(&stream);
              uVar39 = (ulong)uVar23;
            }
            else if (uVar55 != 0x50494e46) {
              if (uVar55 == 0x534d5458) {
                fVar58 = StreamReader<false,_false>::Get<float>(&stream);
                light = (aiLight *)CONCAT44(light._4_4_,fVar58);
                local_828._M_allocated_capacity._0_4_ =
                     StreamReader<false,_false>::Get<float>(&stream);
                local_818 = StreamReader<false,_false>::Get<float>(&stream);
                local_808 = StreamReader<false,_false>::Get<float>(&stream);
                fVar58 = StreamReader<false,_false>::Get<float>(&stream);
                light = (aiLight *)CONCAT44(fVar58,(uint)light);
                local_828._M_allocated_capacity._4_4_ =
                     StreamReader<false,_false>::Get<float>(&stream);
                local_814 = StreamReader<false,_false>::Get<float>(&stream);
                local_804 = StreamReader<false,_false>::Get<float>(&stream);
                local_830 = StreamReader<false,_false>::Get<float>(&stream);
                local_828._8_4_ = StreamReader<false,_false>::Get<float>(&stream);
                local_810 = StreamReader<false,_false>::Get<float>(&stream);
                local_800 = StreamReader<false,_false>::Get<float>(&stream);
                local_82c = StreamReader<false,_false>::Get<float>(&stream);
                local_828._12_4_ = StreamReader<false,_false>::Get<float>(&stream);
                local_80c = StreamReader<false,_false>::Get<float>(&stream);
                local_7fc = StreamReader<false,_false>::Get<float>(&stream);
                uVar5 = local_f40->a1;
                uVar6 = local_f40->a2;
                fVar15 = local_f40->a3;
                fVar16 = local_f40->a4;
                fVar60 = local_f40->b1;
                fVar12 = local_f40->b2;
                fVar13 = local_f40->b3;
                fVar14 = local_f40->b4;
                uVar7 = local_f40->c1;
                uVar8 = local_f40->c2;
                uVar9 = local_f40->c3;
                uVar10 = local_f40->c4;
                fVar58 = local_f40->d1;
                fVar61 = local_f40->d2;
                fVar62 = local_f40->d3;
                fVar59 = local_f40->d4;
                chunk.Tag = uVar5;
                chunk.Size = uVar6;
                aiMatrix4x4t<float>::operator*=
                          ((aiMatrix4x4t<float> *)&chunk,(aiMatrix4x4t<float> *)&light);
                local_f40->d1 = fVar58;
                local_f40->d2 = fVar61;
                local_f40->d3 = fVar62;
                local_f40->d4 = fVar59;
                local_f40->c1 = (float)uVar7;
                local_f40->c2 = (float)uVar8;
                local_f40->c3 = (float)uVar9;
                local_f40->c4 = (float)uVar10;
                local_f40->b1 = fVar60;
                local_f40->b2 = fVar12;
                local_f40->b3 = fVar13;
                local_f40->b4 = fVar14;
                local_f40->a1 = (float)chunk.Tag;
                local_f40->a2 = (float)chunk.Size;
                local_f40->a3 = fVar15;
                local_f40->a4 = fVar16;
              }
              else if (uVar55 == 0x41584953) {
                ReadAxis(local_f40,&stream);
              }
              else {
                UnknownChunk((StreamReaderLE *)&worldToLocal,pSVar49);
              }
            }
          }
          StreamReader<false,_false>::SetCurrentPos
                    (&stream,(ulong)(uint)((int)stream.limit - (int)stream.buffer));
          StreamReader<false,_false>::SetReadLimit(&stream,uVar48);
        }
        if ((ulong)(((long)sib.objs.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)sib.objs.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl
                          .super__Vector_impl_data._M_start) / 0x458) <= uVar39) {
          pDVar36 = (DeadlyImportError *)
                    __cxa_allocate_exception
                              (0x10,uVar39,
                               ((long)sib.objs.
                                      super__Vector_base<SIBObject,_std::allocator<SIBObject>_>.
                                      _M_impl.super__Vector_impl_data._M_finish -
                               (long)sib.objs.
                                     super__Vector_base<SIBObject,_std::allocator<SIBObject>_>.
                                     _M_impl.super__Vector_impl_data._M_start) % 0x458);
          std::__cxx11::string::string
                    ((string *)&light,"SIB: Invalid shape index.",(allocator *)&chunk);
          DeadlyImportError::DeadlyImportError(pDVar36,(string *)&light);
          __cxa_throw(pDVar36,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        local_848 = sib.objs.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar39].meshIdx;
        local_840 = sib.objs.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar39].meshCount;
        std::vector<SIBObject,_std::allocator<SIBObject>_>::push_back
                  (&sib.insts,(value_type *)&faceNormals);
      }
      else if (uVar55 == 0x4c474854) {
        this_01 = (aiLight *)operator_new(0x46c);
        aiLight::aiLight(this_01);
        light = this_01;
        while (((int)stream.limit - (int)stream.current & 0xfffffff8U) != 0) {
          SVar25 = ReadChunk(&stream);
          chunk.Tag = SVar25.Tag;
          uVar55 = chunk.Tag;
          chunk.Size = SVar25.Size;
          uVar53 = chunk.Size;
          uVar48 = ((int)stream.current - (int)stream.buffer) + chunk.Size;
          pSVar49 = (SIBChunk *)(ulong)uVar48;
          uVar48 = StreamReader<false,_false>::SetReadLimit(&stream,uVar48);
          if (uVar55 == 0x534e414d) {
            ReadString((aiString *)&faceNormals,&stream,uVar53 >> 1);
            uVar39 = (ulong)faceNormals.
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start & 0xffffffff;
            (this_01->mName).length =
                 (ai_uint32)
                 faceNormals.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
            memcpy((this_01->mName).data,
                   (void *)((long)&faceNormals.
                                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 4),uVar39);
            (this_01->mName).data[uVar39] = '\0';
          }
          else if (uVar55 == 0x4c4e464f) {
            uVar23 = StreamReader<false,_false>::Get<unsigned_int>(&stream);
            aVar37 = aiLightSource_UNDEFINED;
            if (uVar23 < 3) {
              aVar37 = *(aiLightSourceType *)(&DAT_005d7a1c + (ulong)uVar23 * 4);
            }
            this_01->mType = aVar37;
            fVar58 = StreamReader<false,_false>::Get<float>(&stream);
            (this_01->mPosition).x = fVar58;
            fVar58 = StreamReader<false,_false>::Get<float>(&stream);
            (this_01->mPosition).y = fVar58;
            fVar58 = StreamReader<false,_false>::Get<float>(&stream);
            (this_01->mPosition).z = fVar58;
            fVar58 = StreamReader<false,_false>::Get<float>(&stream);
            (this_01->mDirection).x = fVar58;
            fVar58 = StreamReader<false,_false>::Get<float>(&stream);
            (this_01->mDirection).y = fVar58;
            fVar58 = StreamReader<false,_false>::Get<float>(&stream);
            (this_01->mDirection).z = fVar58;
            ReadColor((StreamReaderLE *)&faceNormals);
            *(pointer *)&this_01->mColorDiffuse =
                 faceNormals.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
            (this_01->mColorDiffuse).b =
                 faceNormals.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish._0_4_;
            ReadColor((StreamReaderLE *)&faceNormals);
            *(pointer *)&this_01->mColorAmbient =
                 faceNormals.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
            (this_01->mColorAmbient).b =
                 faceNormals.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish._0_4_;
            ReadColor((StreamReaderLE *)&faceNormals);
            *(pointer *)&this_01->mColorSpecular =
                 faceNormals.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
            (this_01->mColorSpecular).b =
                 faceNormals.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish._0_4_;
            fVar61 = StreamReader<false,_false>::Get<float>(&stream);
            fVar62 = StreamReader<false,_false>::Get<float>(&stream);
            fVar58 = StreamReader<false,_false>::Get<float>(&stream);
            this_01->mAttenuationConstant = fVar58;
            fVar58 = StreamReader<false,_false>::Get<float>(&stream);
            this_01->mAttenuationLinear = fVar58;
            fVar58 = StreamReader<false,_false>::Get<float>(&stream);
            this_01->mAttenuationQuadratic = fVar58;
            fVar58 = 1e-05;
            if (1e-05 <= fVar61) {
              fVar58 = fVar61;
            }
            local_f68 = (pointer)CONCAT44(local_f68._4_4_,1.0 / fVar58);
            fVar58 = powf(0.99,1.0 / fVar58);
            fVar61 = acosf(fVar58);
            fVar58 = powf(0.01,(float)local_f68);
            fVar59 = acosf(fVar58);
            fVar58 = fVar62 * 0.017453292;
            if (fVar59 <= fVar62 * 0.017453292) {
              fVar58 = fVar59;
            }
            fVar62 = fVar58;
            if (fVar61 <= fVar58) {
              fVar62 = fVar61;
            }
            this_01->mAngleInnerCone = fVar62;
            this_01->mAngleOuterCone = fVar58;
          }
          else {
            UnknownChunk((StreamReaderLE *)&chunk,pSVar49);
          }
          StreamReader<false,_false>::SetCurrentPos
                    (&stream,(ulong)(uint)((int)stream.limit - (int)stream.buffer));
          StreamReader<false,_false>::SetReadLimit(&stream,uVar48);
        }
        std::vector<aiLight_*,_std::allocator<aiLight_*>_>::push_back(&sib.lights,&light);
      }
      else if (uVar55 == 0x4d415452) {
        ReadColor((StreamReaderLE *)&chunk);
        ReadColor((StreamReaderLE *)&worldToLocal);
        ReadColor((StreamReaderLE *)&worldToLocalN);
        ReadColor((StreamReaderLE *)&meshes);
        uVar48 = StreamReader<false,_false>::Get<unsigned_int>(&stream);
        shiny = (float)uVar48;
        uVar48 = StreamReader<false,_false>::Get<unsigned_int>(&stream);
        ReadString((aiString *)&faceNormals,&stream,uVar48 >> 1);
        uVar48 = StreamReader<false,_false>::Get<unsigned_int>(&stream);
        ReadString((aiString *)&light,&stream,uVar48 >> 1);
        paVar27 = (aiMesh *)operator_new(0x10);
        aiMaterial::aiMaterial((aiMaterial *)paVar27);
        local_f88._0_8_ = paVar27;
        aiMaterial::AddProperty((aiMaterial *)paVar27,(aiColor3D *)&chunk,1,"$clr.diffuse",0,0);
        aiMaterial::AddProperty
                  ((aiMaterial *)paVar27,(aiColor3D *)&worldToLocal,1,"$clr.ambient",0,0);
        aiMaterial::AddProperty
                  ((aiMaterial *)paVar27,(aiColor3D *)&worldToLocalN,1,"$clr.specular",0,0);
        aiMaterial::AddProperty((aiMaterial *)paVar27,(aiColor3D *)&meshes,1,"$clr.emissive",0,0);
        aiMaterial::AddProperty((aiMaterial *)paVar27,&shiny,1,"$mat.shininess",0,0);
        aiMaterial::AddProperty((aiMaterial *)paVar27,(aiString *)&faceNormals,"?mat.name",0,0);
        if ((uint)light != 0) {
          aiMaterial::AddProperty((aiMaterial *)paVar27,(aiString *)&light,"$tex.file",1,0);
          aiMaterial::AddProperty((aiMaterial *)paVar27,(aiString *)&light,"$tex.file",3,0);
        }
        std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::push_back
                  (&sib.mtls,(value_type *)&local_f88);
      }
      else if (uVar55 == 0x53484150) {
        chunk.Tag = 0x3f800000;
        chunk.Size = 0;
        local_d80._M_color = _S_red;
        local_d80._M_parent = (_Base_ptr)0x0;
        local_f48 = 0;
        memset(&local_e30,0,0xa8);
        local_d80._M_left = &local_d80;
        local_d60 = 0;
        light._0_5_ = (uint5)(uint)light;
        local_d80._M_right = local_d80._M_left;
        memset((void *)((long)&light + 5),0x1b,0x3ff);
        while (((int)stream.limit - (int)stream.current & 0xfffffff8U) != 0) {
          SVar25 = ReadChunk(&stream);
          uVar48 = ((int)stream.current - (int)stream.buffer) + SVar25.Size;
          pSVar49 = (SIBChunk *)(ulong)uVar48;
          worldToLocal._0_8_ = SVar25;
          uVar48 = StreamReader<false,_false>::SetReadLimit(&stream,uVar48);
          uVar55 = SVar25.Tag;
          if (uVar55 == 0x41584953) {
            ReadAxis((aiMatrix4x4 *)&chunk,&stream);
          }
          else if (uVar55 != 0x44494e46) {
            if (uVar55 == 0x56525453) {
              std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                        (&local_e30,(ulong)SVar25 / 0xc00000000);
              for (lVar50 = 0; ((ulong)SVar25 / 0xc00000000) * 0xc - lVar50 != 0;
                  lVar50 = lVar50 + 0xc) {
                fVar58 = StreamReader<false,_false>::Get<float>(&stream);
                *(float *)((long)&(local_e30.
                                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->x + lVar50) = fVar58;
                fVar58 = StreamReader<false,_false>::Get<float>(&stream);
                *(float *)((long)&(local_e30.
                                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->y + lVar50) = fVar58;
                fVar58 = StreamReader<false,_false>::Get<float>(&stream);
                *(float *)((long)&(local_e30.
                                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->z + lVar50) = fVar58;
              }
            }
            else if (uVar55 == 0x45444753) {
              while ((int)stream.limit != (int)stream.current) {
                uVar23 = StreamReader<false,_false>::Get<unsigned_int>(&stream);
                uVar24 = StreamReader<false,_false>::Get<unsigned_int>(&stream);
                GetEdge((SIBMesh *)&chunk,uVar23,uVar24);
              }
            }
            else if (uVar55 == 0x46414353) {
              sVar42 = 0;
              while( true ) {
                if ((int)stream.limit == (int)stream.current) break;
                uVar23 = StreamReader<false,_false>::Get<unsigned_int>(&stream);
                lVar52 = (long)local_de8.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_de8.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start;
                lVar50 = lVar52 >> 2;
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                          (&local_de8,lVar50 + (ulong)(uVar23 * 3) + 1);
                *(uint *)((long)local_de8.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar52) = uVar23;
                puVar34 = local_de8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start + lVar50 + 1;
                faceNormals.
                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                super__Vector_impl_data._M_start =
                     (pointer)CONCAT44(faceNormals.
                                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,(int)lVar50);
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                          (&local_dd0,(uint *)&faceNormals);
                faceNormals.
                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                super__Vector_impl_data._M_start =
                     (pointer)((ulong)faceNormals.
                                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000
                              );
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                          (&local_db8,(uint *)&faceNormals);
                uVar24 = uVar23 + (int)sVar42;
                while (bVar57 = uVar23 != 0, uVar23 = uVar23 - 1, bVar57) {
                  uVar41 = StreamReader<false,_false>::Get<unsigned_int>(&stream);
                  if ((ulong)(((long)local_e30.
                                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_e30.
                                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0xc) <=
                      (ulong)uVar41) {
                    pDVar36 = (DeadlyImportError *)
                              __cxa_allocate_exception
                                        (0x10,(ulong)uVar41,
                                         ((long)local_e30.
                                                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)local_e30.
                                               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start) % 0xc);
                    std::__cxx11::string::string
                              ((string *)&faceNormals,"Vertex index is out of range.",
                               (allocator *)&worldToLocalN);
                    DeadlyImportError::DeadlyImportError(pDVar36,(string *)&faceNormals);
                    __cxa_throw(pDVar36,&DeadlyImportError::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  *puVar34 = uVar41;
                  uVar41 = (uint)sVar42;
                  puVar34[1] = uVar41;
                  puVar34[2] = uVar41;
                  puVar34 = puVar34 + 3;
                  sVar42 = (size_type)(uVar41 + 1);
                }
                sVar42 = (size_type)uVar24;
              }
              faceNormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              faceNormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   (pointer)((ulong)faceNormals.
                                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000)
              ;
              std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                        (&local_e18,sVar42,(value_type *)&faceNormals);
              faceNormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              faceNormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   (pointer)((ulong)faceNormals.
                                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000)
              ;
              std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                        (&local_e00,sVar42,(value_type *)&faceNormals);
            }
            else if (uVar55 != 0x46414853) {
              if (uVar55 == 0x46414d41) {
                uVar23 = StreamReader<false,_false>::Get<unsigned_int>(&stream);
                uVar24 = StreamReader<false,_false>::Get<unsigned_int>(&stream);
                while( true ) {
                  uVar39 = (ulong)uVar23;
                  uVar41 = uVar24 + 1;
                  if ((int)stream.limit == (int)stream.current) break;
                  uVar23 = StreamReader<false,_false>::Get<unsigned_int>(&stream);
                  uVar24 = StreamReader<false,_false>::Get<unsigned_int>(&stream);
                  for (; uVar39 < uVar23; uVar39 = uVar39 + 1) {
                    if ((ulong)((long)local_db8.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_db8.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 2) <= uVar39) {
                      pDVar36 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
                      std::__cxx11::string::string
                                ((string *)&faceNormals,"Invalid face index.",
                                 (allocator *)&worldToLocalN);
                      DeadlyImportError::DeadlyImportError(pDVar36,(string *)&faceNormals);
                      __cxa_throw(pDVar36,&DeadlyImportError::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    local_db8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar39] = uVar41;
                  }
                }
                for (; uVar39 < (ulong)((long)local_db8.
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)local_db8.
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_start >> 2);
                    uVar39 = (ulong)((int)uVar39 + 1)) {
                  local_db8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar39] = uVar41;
                }
              }
              else if (uVar55 != 0x464d4952) {
                if (uVar55 == 0x46545653) {
                  while ((int)stream.limit != (int)stream.current) {
                    uVar23 = StreamReader<false,_false>::Get<unsigned_int>(&stream);
                    uVar24 = StreamReader<false,_false>::Get<unsigned_int>(&stream);
                    if ((ulong)((long)local_dd0.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_dd0.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 2) <=
                        (ulong)uVar23) {
                      pDVar36 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
                      std::__cxx11::string::string
                                ((string *)&faceNormals,"Invalid face index.",
                                 (allocator *)&worldToLocalN);
                      DeadlyImportError::DeadlyImportError(pDVar36,(string *)&faceNormals);
                      __cxa_throw(pDVar36,&DeadlyImportError::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    puVar34 = local_de8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start +
                              (ulong)(local_dd0.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar23] + 1) + 2;
                    while (bVar57 = uVar24 != 0, uVar24 = uVar24 - 1, bVar57) {
                      uVar23 = *puVar34;
                      fVar58 = StreamReader<false,_false>::Get<float>(&stream);
                      local_e00.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar23].x = fVar58;
                      fVar58 = StreamReader<false,_false>::Get<float>(&stream);
                      local_e00.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar23].y = fVar58;
                      puVar34 = puVar34 + 3;
                    }
                  }
                }
                else if (((uVar55 != 0x494d5250) && (uVar55 != 0x4d495250)) &&
                        (uVar55 != 0x50494e46)) {
                  if (uVar55 == 0x534e414d) {
                    ReadString((aiString *)&faceNormals,&stream,SVar25.Size >> 1);
                    uVar39 = (ulong)faceNormals.
                                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start & 0xffffffff;
                    memcpy((void *)((long)&light + 4),
                           (void *)((long)&faceNormals.
                                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + 4),uVar39);
                    *(undefined1 *)((long)&light + uVar39 + 4) = 0;
                    local_f48 = uVar39;
                  }
                  else if ((uVar55 != 0x5458534d) && (uVar55 != 0x564d4952)) {
                    if (uVar55 == 0x45435253) {
                      while ((int)stream.limit != (int)stream.current) {
                        uVar23 = StreamReader<false,_false>::Get<unsigned_int>(&stream);
                        if ((ulong)(((long)local_d98 - (long)local_da0) / 0xc) <= (ulong)uVar23) {
                          pDVar36 = (DeadlyImportError *)
                                    __cxa_allocate_exception
                                              (0x10,local_da0,
                                               ((long)local_d98 - (long)local_da0) % 0xc);
                          std::__cxx11::string::string
                                    ((string *)&faceNormals,"SIB: Invalid edge index.",
                                     (allocator *)&worldToLocalN);
                          DeadlyImportError::DeadlyImportError(pDVar36,(string *)&faceNormals);
                          __cxa_throw(pDVar36,&DeadlyImportError::typeinfo,
                                      std::runtime_error::~runtime_error);
                        }
                        local_da0[uVar23].creased = true;
                      }
                    }
                    else {
                      UnknownChunk((StreamReaderLE *)&worldToLocal,pSVar49);
                    }
                  }
                }
              }
            }
          }
          StreamReader<false,_false>::SetCurrentPos
                    (&stream,(ulong)(uint)((int)stream.limit - (int)stream.buffer));
          StreamReader<false,_false>::SetReadLimit(&stream,uVar48);
        }
        light = (aiLight *)CONCAT44(light._4_4_,(int)local_f48);
        lVar50 = (long)local_dd0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_dd0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start;
        if (lVar50 != (long)local_db8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_db8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start) {
          __assert_fail("smesh.faceStart.size() == smesh.mtls.size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/SIB/SIBImporter.cpp"
                        ,0x238,"void ReadShape(SIB *, StreamReaderLE *)");
        }
        for (lVar52 = 0; lVar52 != lVar50 >> 2; lVar52 = lVar52 + 1) {
          puVar43 = local_de8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start +
                    local_dd0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar52] + 1;
          uVar48 = local_de8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start
                   [local_dd0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar52]];
          uVar55 = local_de8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start
                   [(ulong)local_dd0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar52] +
                    (ulong)(uVar48 * 3 - 3) + 1];
          while (bVar57 = uVar48 != 0, uVar48 = uVar48 - 1, bVar57) {
            uVar53 = *puVar43;
            pSVar26 = GetEdge((SIBMesh *)&chunk,uVar55,uVar53);
            if (pSVar26->faceA == 0xffffffff) {
LAB_00513fd5:
              pSVar26->faceA = (uint32_t)lVar52;
            }
            else if (pSVar26->faceB == 0xffffffff) {
              pSVar26 = (SIBEdge *)&pSVar26->faceB;
              goto LAB_00513fd5;
            }
            puVar43 = puVar43 + 3;
            uVar55 = uVar53;
          }
        }
        __n_00 = (long)local_dd0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_dd0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 2;
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
                  (&faceNormals,__n_00,(allocator_type *)&worldToLocal);
        for (sVar42 = 0; sVar42 != __n_00; sVar42 = sVar42 + 1) {
          puVar34 = local_de8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start +
                    local_dd0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start[sVar42];
          uVar48 = *puVar34;
          uVar39 = (ulong)uVar48 * 3 - 3 & 0xffffffff;
          fVar61 = 0.0;
          fVar62 = 0.0;
          fVar58 = 0.0;
          for (uVar51 = 0; lVar50 = uVar39 + 1, (ulong)uVar48 * 3 != uVar51; uVar51 = uVar51 + 3) {
            uVar39 = uVar51 & 0xffffffff;
            aVar63 = operator^(local_e30.
                               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + puVar34[lVar50],
                               local_e30.
                               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + puVar34[uVar39 + 1]);
            fVar61 = fVar61 + aVar63.x;
            fVar62 = fVar62 + aVar63.y;
            fVar58 = fVar58 + aVar63.z;
          }
          faceNormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start[sVar42].x = fVar61;
          faceNormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start[sVar42].y = fVar62;
          faceNormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start[sVar42].z = fVar58;
        }
        for (sVar42 = 0; sVar42 != __n_00; sVar42 = sVar42 + 1) {
          puVar34 = local_de8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start +
                    local_dd0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start[sVar42];
          uVar48 = *puVar34;
          for (uVar39 = 0; uVar39 != uVar48; uVar39 = uVar39 + 1) {
            uVar23 = puVar34[(ulong)(uint)((int)uVar39 * 3) + 1];
            uVar24 = puVar34[(ulong)((int)uVar39 * 3 + 1) + 1];
            fVar58 = 0.0;
            local_f68 = (pointer)0x0;
            uStack_f60 = 0;
            local_f70 = (pointer)CONCAT44(local_f70._4_4_,(int)sVar42);
            iVar22 = 0;
            while (iVar22 != 2) {
              local_f38 = CONCAT44(local_f38._4_4_,iVar22);
              fVar58 = 0.0;
              local_f68 = (pointer)0x0;
              uStack_f60 = 0;
              uVar51 = (ulong)local_f70 & 0xffffffff;
              ppaVar11 = local_f70;
              do {
                uVar47 = uVar51;
                uVar45 = (uint32_t)uVar47;
                uVar28 = uVar47 & 0xffffffff;
                uVar1 = faceNormals.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar28].x;
                uVar2 = faceNormals.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar28].y;
                local_f68 = (pointer)CONCAT44((float)uVar2 + local_f68._4_4_,
                                              (float)uVar1 + (float)local_f68);
                uStack_f60 = CONCAT44(uStack_f60._4_4_ + 0.0,(float)uStack_f60 + 0.0);
                local_f30 = (pointer)CONCAT44(local_f30._4_4_,
                                              faceNormals.
                                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start[uVar28].z);
                puVar43 = local_de8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start +
                          (ulong)local_dd0.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar28] + 1;
                uVar55 = puVar43[-1];
                uVar51 = 0xffffffffffffffff;
                uVar53 = local_de8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start
                         [(ulong)local_dd0.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar28] +
                          (ulong)(uVar55 * 3 - 3) + 1];
                while( true ) {
                  bVar57 = uVar55 == 0;
                  uVar55 = uVar55 - 1;
                  uVar46 = (uint32_t)uVar51;
                  if (bVar57) break;
                  posB = *puVar43;
                  uVar38 = uVar46;
                  if ((uVar53 == uVar23) || (posB == uVar23)) {
                    pSVar26 = GetEdge((SIBMesh *)&chunk,uVar53,posB);
                    uVar53 = pSVar26->faceA;
                    uVar3 = pSVar26->faceB;
                    if ((((uVar53 == uVar45) || (uVar3 == uVar45)) && (pSVar26->creased == false))
                       && (((uVar53 == uVar45 || (uVar53 == (uint32_t)ppaVar11)) ||
                           (uVar38 = uVar53, uVar53 == 0xffffffff)))) {
                      uVar38 = uVar3;
                      if (uVar3 == 0xffffffff) {
                        uVar38 = uVar46;
                      }
                      if (uVar3 == (uint32_t)ppaVar11) {
                        uVar38 = uVar46;
                      }
                      if (uVar3 == uVar45) {
                        uVar38 = uVar46;
                      }
                    }
                  }
                  puVar43 = puVar43 + 3;
                  uVar51 = (ulong)uVar38;
                  uVar53 = posB;
                }
                fVar58 = fVar58 + local_f30._0_4_;
              } while ((uVar46 != 0xffffffff) &&
                      (ppaVar11 = (pointer)uVar47, uVar46 != (uint32_t)local_f70));
              local_f70 = (pointer)CONCAT44(local_f70._4_4_,uVar45);
              iVar22 = (int)local_f38 + 1;
            }
            fVar60 = SQRT(fVar58 * fVar58 +
                          (float)local_f68 * (float)local_f68 + local_f68._4_4_ * local_f68._4_4_);
            fVar59 = 1.0 / fVar60;
            fVar61 = (float)local_f68;
            fVar62 = local_f68._4_4_;
            if (1e-09 < fVar60) {
              fVar61 = (float)local_f68 * fVar59;
              fVar62 = local_f68._4_4_ * fVar59;
            }
            local_e18.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar24].x = fVar61;
            local_e18.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar24].y = fVar62;
            local_e18.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar24].z =
                 (float)(~-(uint)(1e-09 < fVar60) & (uint)fVar58 |
                        (uint)(fVar59 * fVar58) & -(uint)(1e-09 < fVar60));
          }
        }
        std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
                  (&faceNormals.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>);
        worldToLocal.a2 = (float)chunk.Size;
        worldToLocal.a1 = (float)chunk.Tag;
        worldToLocal.a3 = 0.0;
        worldToLocal.a4 = 0.0;
        worldToLocal.b1 = 0.0;
        worldToLocal.b2 = 1.0;
        worldToLocal.c3 = 1.0;
        worldToLocal.c4 = 0.0;
        worldToLocal.d1 = 0.0;
        worldToLocal.d2 = 0.0;
        worldToLocal.d3 = 0.0;
        worldToLocal.d4 = 1.0;
        worldToLocal.c1 = 0.0;
        worldToLocal.c2 = 0.0;
        worldToLocal.b3 = 0.0;
        worldToLocal.b4 = 0.0;
        aiMatrix4x4t<float>::Inverse(&worldToLocal);
        worldToLocalN.c1 = worldToLocal.c1;
        worldToLocalN.c2 = worldToLocal.c2;
        worldToLocalN.b1 = worldToLocal.b1;
        worldToLocalN.b2 = worldToLocal.b2;
        worldToLocalN.a1 = worldToLocal.a1;
        worldToLocalN.a2 = worldToLocal.a2;
        worldToLocalN.d1 = worldToLocal.d1;
        worldToLocalN.d2 = worldToLocal.d2;
        worldToLocalN.d3 = worldToLocal.d3;
        worldToLocalN.d4 = worldToLocal.d4;
        worldToLocalN._40_8_ = worldToLocal._40_8_ & 0xffffffff;
        worldToLocalN._24_8_ = worldToLocal._24_8_ & 0xffffffff;
        worldToLocalN._8_8_ = worldToLocal._8_8_ & 0xffffffff;
        this_02 = aiMatrix4x4t<float>::Inverse(&worldToLocalN);
        aiMatrix4x4t<float>::Transpose(this_02);
        std::vector<TempMesh,_std::allocator<TempMesh>_>::vector
                  (&meshes,(long)sib.mtls.
                                 super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)sib.mtls.
                                 super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3,
                   (allocator_type *)&faceNormals);
        for (uVar48 = 0; uVar39 = (ulong)uVar48,
            uVar39 < (ulong)((long)local_dd0.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_dd0.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 2);
            uVar48 = uVar48 + 1) {
          uVar51 = (ulong)local_db8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar39];
          puVar34 = local_de8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start +
                    local_dd0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar39];
          if ((ulong)(((long)meshes.super__Vector_base<TempMesh,_std::allocator<TempMesh>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)meshes.super__Vector_base<TempMesh,_std::allocator<TempMesh>_>._M_impl.
                            super__Vector_impl_data._M_start) / 0x60) <= uVar51) {
            this_03 = DefaultLogger::get();
            Logger::error(this_03,"SIB: Face material index is invalid.");
            uVar51 = 0;
          }
          pTVar54 = meshes.super__Vector_base<TempMesh,_std::allocator<TempMesh>_>._M_impl.
                    super__Vector_impl_data._M_start;
          faceNormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          uVar23 = *puVar34;
          uVar39 = (ulong)uVar23;
          faceNormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44((int)((ulong)faceNormals.
                                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start >> 0x20),
                                 uVar23);
          faceNormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)operator_new__(uVar39 << 2);
          pTVar54 = pTVar54 + uVar51;
          puVar34 = puVar34 + 1;
          for (uVar51 = 0; uVar51 < uVar39; uVar51 = uVar51 + 1) {
            (&(faceNormals.
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_finish)->x)[uVar51] =
                 (float)(((long)(pTVar54->vtx).
                                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pTVar54->vtx).
                               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0xc);
            local_f88._0_8_ =
                 *(undefined8 *)
                  (local_e30.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start + *puVar34);
            local_f88.z = local_e30.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[*puVar34].z;
            shiny = local_e18.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start[puVar34[1]].x;
            fStack_f54 = local_e18.
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start[puVar34[1]].y;
            local_f50 = local_e18.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start[puVar34[1]].z;
            uv.x = local_e00.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[puVar34[2]].x;
            uv.y = local_e00.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[puVar34[2]].y;
            uv.z = local_e00.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[puVar34[2]].z;
            aVar63 = ::operator*(&worldToLocal,&local_f88);
            local_f88.z = aVar63.z;
            local_f88._0_8_ = aVar63._0_8_;
            aVar63 = ::operator*(&worldToLocalN,(aiVector3t<float> *)&shiny);
            local_f50 = aVar63.z;
            _shiny = aVar63._0_8_;
            std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                      (&pTVar54->vtx,&local_f88);
            std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                      (&pTVar54->nrm,(value_type *)&shiny);
            std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                      (&pTVar54->uv,&uv);
            puVar34 = puVar34 + 3;
            uVar39 = (ulong)faceNormals.
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start & 0xffffffff;
          }
          std::vector<aiFace,_std::allocator<aiFace>_>::push_back
                    (&pTVar54->faces,(value_type *)&faceNormals);
          aiFace::~aiFace((aiFace *)&faceNormals);
        }
        faceNormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start._0_5_ =
             CONCAT14(0,(ai_uint32)
                        faceNormals.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start);
        memset((void *)((long)&faceNormals.
                               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + 5),0x1b,0x3ff);
        faceNormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(faceNormals.
                               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,(int)local_f48);
        uVar51 = local_f48 & 0xffffffff;
        memcpy((void *)((long)&faceNormals.
                               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + 4),
               (void *)((long)&light + 4),uVar51);
        *(undefined1 *)
         ((long)&faceNormals.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar51 + 4) = 0;
        local_f40->d1 = 0.0;
        local_f40->d2 = 0.0;
        local_f40->d3 = 0.0;
        local_f40->d4 = 1.0;
        local_f40->c1 = 0.0;
        local_f40->c2 = 0.0;
        local_f40->c3 = 1.0;
        local_f40->c4 = 0.0;
        local_f40->b1 = 0.0;
        local_f40->b2 = 1.0;
        local_f40->b3 = 0.0;
        local_f40->b4 = 0.0;
        local_f40->a1 = (float)chunk.Tag;
        local_f40->a2 = (float)chunk.Size;
        local_f40->a3 = 0.0;
        local_f40->a4 = 0.0;
        local_f68 = (pointer)((long)sib.meshes.
                                    super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                              (long)sib.meshes.
                                    super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                                    super__Vector_impl_data._M_start >> 3);
        local_848 = (size_t)local_f68;
        for (uVar39 = 0;
            pTVar54 = meshes.super__Vector_base<TempMesh,_std::allocator<TempMesh>_>._M_impl.
                      super__Vector_impl_data._M_start,
            uVar39 < (ulong)(((long)meshes.super__Vector_base<TempMesh,_std::allocator<TempMesh>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)meshes.super__Vector_base<TempMesh,_std::allocator<TempMesh>_>.
                                   _M_impl.super__Vector_impl_data._M_start) / 0x60);
            uVar39 = uVar39 + 1) {
          if (meshes.super__Vector_base<TempMesh,_std::allocator<TempMesh>_>._M_impl.
              super__Vector_impl_data._M_start[uVar39].faces.
              super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data.
              _M_start !=
              meshes.super__Vector_base<TempMesh,_std::allocator<TempMesh>_>._M_impl.
              super__Vector_impl_data._M_start[uVar39].faces.
              super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data.
              _M_finish) {
            paVar27 = (aiMesh *)operator_new(0x520);
            pTVar54 = pTVar54 + uVar39;
            aiMesh::aiMesh(paVar27);
            (paVar27->mName).length = (ai_uint32)local_f48;
            local_f88._0_8_ = paVar27;
            memcpy((paVar27->mName).data,(void *)((long)&light + 4),uVar51);
            (paVar27->mName).data[uVar51] = '\0';
            uVar28 = (long)(pTVar54->faces).super__Vector_base<aiFace,_std::allocator<aiFace>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(pTVar54->faces).super__Vector_base<aiFace,_std::allocator<aiFace>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 4;
            paVar27->mNumFaces = (uint)uVar28;
            uVar28 = uVar28 & 0xffffffff;
            puVar29 = (ulong *)operator_new__(uVar28 * 0x10 + 8);
            *puVar29 = uVar28;
            paVar30 = (aiFace *)(puVar29 + 1);
            if (uVar28 != 0) {
              paVar40 = paVar30;
              do {
                paVar40->mNumIndices = 0;
                paVar40->mIndices = (uint *)0x0;
                paVar40 = paVar40 + 1;
              } while (paVar40 != paVar30 + uVar28);
            }
            paVar27->mFaces = paVar30;
            uVar28 = ((long)(pTVar54->vtx).
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pTVar54->vtx).
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0xc;
            uVar48 = (uint)uVar28;
            paVar27->mNumVertices = uVar48;
            uVar47 = (uVar28 & 0xffffffff) * 0xc;
            paVar31 = (aiVector3D *)operator_new__(uVar47);
            if (uVar48 != 0) {
              memset(paVar31,0,uVar47 - (uVar47 - 0xc) % 0xc);
            }
            paVar27->mVertices = paVar31;
            paVar31 = (aiVector3D *)operator_new__(uVar47);
            if (uVar48 != 0) {
              memset(paVar31,0,uVar47 - (uVar47 - 0xc) % 0xc);
            }
            paVar27->mNormals = paVar31;
            paVar31 = (aiVector3D *)operator_new__(uVar47);
            if (uVar48 != 0) {
              memset(paVar31,0,uVar47 - (uVar47 - 0xc) % 0xc);
            }
            paVar27->mTextureCoords[0] = paVar31;
            paVar27->mNumUVComponents[0] = 2;
            paVar27->mMaterialIndex = (uint)uVar39;
            lVar50 = 0;
            for (uVar47 = 0; uVar47 < (uVar28 & 0xffffffff); uVar47 = uVar47 + 1) {
              paVar4 = (pTVar54->vtx).
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              paVar31 = paVar27->mVertices;
              *(undefined4 *)((long)&paVar31->z + lVar50) =
                   *(undefined4 *)((long)&paVar4->z + lVar50);
              *(undefined8 *)((long)&paVar31->x + lVar50) =
                   *(undefined8 *)((long)&paVar4->x + lVar50);
              paVar4 = (pTVar54->nrm).
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              paVar31 = paVar27->mNormals;
              *(undefined4 *)((long)&paVar31->z + lVar50) =
                   *(undefined4 *)((long)&paVar4->z + lVar50);
              *(undefined8 *)((long)&paVar31->x + lVar50) =
                   *(undefined8 *)((long)&paVar4->x + lVar50);
              paVar4 = (pTVar54->uv).
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              paVar31 = paVar27->mTextureCoords[0];
              *(undefined4 *)((long)&paVar31->z + lVar50) =
                   *(undefined4 *)((long)&paVar4->z + lVar50);
              *(undefined8 *)((long)&paVar31->x + lVar50) =
                   *(undefined8 *)((long)&paVar4->x + lVar50);
              uVar28 = (ulong)paVar27->mNumVertices;
              lVar50 = lVar50 + 0xc;
            }
            lVar50 = 0;
            for (uVar28 = 0; uVar28 < paVar27->mNumFaces; uVar28 = uVar28 + 1) {
              aiFace::operator=((aiFace *)((long)&paVar27->mFaces->mNumIndices + lVar50),
                                (aiFace *)
                                ((long)&((pTVar54->faces).
                                         super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl
                                         .super__Vector_impl_data._M_start)->mNumIndices + lVar50));
              lVar50 = lVar50 + 0x10;
              paVar27 = (aiMesh *)local_f88._0_8_;
            }
            std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back
                      (&sib.meshes,(value_type *)&local_f88);
          }
        }
        local_840 = ((long)sib.meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)sib.meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 3) - (long)local_f68;
        std::vector<SIBObject,_std::allocator<SIBObject>_>::push_back
                  (&sib.objs,(value_type *)&faceNormals);
        std::vector<TempMesh,_std::allocator<TempMesh>_>::~vector(&meshes);
        SIBMesh::~SIBMesh((SIBMesh *)&chunk);
      }
      else if (uVar55 == 0x48454144) {
        uVar48 = StreamReader<false,_false>::Get<unsigned_int>(&stream);
        if (uVar48 - 3 < 0xfffffffe) {
          pDVar36 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string
                    ((string *)&faceNormals,"SIB: Unsupported file version.",(allocator *)&light);
          DeadlyImportError::DeadlyImportError(pDVar36,(string *)&faceNormals);
          __cxa_throw(pDVar36,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      else {
        UnknownChunk((StreamReaderLE *)local_cf0,pSVar49);
      }
    }
    StreamReader<false,_false>::SetCurrentPos
              (&stream,(ulong)(uint)((int)stream.limit - (int)stream.buffer));
    StreamReader<false,_false>::SetReadLimit(&stream,local_f24);
  } while( true );
}

Assistant:

void SIBImporter::InternReadFile(const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
    StreamReaderLE stream(pIOHandler->Open(pFile, "rb"));

    // We should have at least one chunk
    if (stream.GetRemainingSize() < 16)
        throw DeadlyImportError("SIB file is either empty or corrupt: " + pFile);

    SIB sib;

    // Default material.
    aiMaterial* defmtl = new aiMaterial;
    aiString defname = aiString(AI_DEFAULT_MATERIAL_NAME);
    defmtl->AddProperty(&defname, AI_MATKEY_NAME);
    sib.mtls.push_back(defmtl);

    // Read it all.
    ReadScene(&sib, &stream);

    // Join the instances and objects together.
    size_t firstInst = sib.objs.size();
    sib.objs.insert(sib.objs.end(), sib.insts.begin(), sib.insts.end());
    sib.insts.clear();

    // Transfer to the aiScene.
    pScene->mNumMaterials = static_cast<unsigned int>(sib.mtls.size());
    pScene->mNumMeshes = static_cast<unsigned int>(sib.meshes.size());
    pScene->mNumLights = static_cast<unsigned int>(sib.lights.size());
    pScene->mMaterials = pScene->mNumMaterials ? new aiMaterial*[pScene->mNumMaterials] : NULL;
    pScene->mMeshes = pScene->mNumMeshes ? new aiMesh*[pScene->mNumMeshes] : NULL;
    pScene->mLights = pScene->mNumLights ? new aiLight*[pScene->mNumLights] : NULL;
    if (pScene->mNumMaterials)
        memcpy(pScene->mMaterials, &sib.mtls[0], sizeof(aiMaterial*) * pScene->mNumMaterials);
    if (pScene->mNumMeshes)
        memcpy(pScene->mMeshes, &sib.meshes[0], sizeof(aiMesh*) * pScene->mNumMeshes);
    if (pScene->mNumLights)
        memcpy(pScene->mLights, &sib.lights[0], sizeof(aiLight*) * pScene->mNumLights);

    // Construct the root node.
    size_t childIdx = 0;
    aiNode *root = new aiNode();
    root->mName.Set("<SIBRoot>");
    root->mNumChildren = static_cast<unsigned int>(sib.objs.size() + sib.lights.size());
    root->mChildren = root->mNumChildren ? new aiNode*[root->mNumChildren] : NULL;
    pScene->mRootNode = root;

    // Add nodes for each object.
    for (size_t n=0;n<sib.objs.size();n++)
    {
        ai_assert(root->mChildren);
        SIBObject& obj = sib.objs[n];
        aiNode* node = new aiNode;
        root->mChildren[childIdx++] = node;
        node->mName = obj.name;
        node->mParent = root;
        node->mTransformation = obj.axis;

        node->mNumMeshes = static_cast<unsigned int>(obj.meshCount);
        node->mMeshes = node->mNumMeshes ? new unsigned[node->mNumMeshes] : NULL;
        for (unsigned i=0;i<node->mNumMeshes;i++)
            node->mMeshes[i] = static_cast<unsigned int>(obj.meshIdx + i);

        // Mark instanced objects as being so.
        if (n >= firstInst)
        {
            node->mMetaData = aiMetadata::Alloc( 1 );
            node->mMetaData->Set( 0, "IsInstance", true );
        }
    }

    // Add nodes for each light.
    // (no transformation as the light is already in world space)
    for (size_t n=0;n<sib.lights.size();n++)
    {
        ai_assert(root->mChildren);
        aiLight* light = sib.lights[n];
        if ( nullptr != light ) {
            aiNode* node = new aiNode;
            root->mChildren[ childIdx++ ] = node;
            node->mName = light->mName;
            node->mParent = root;
        }
    }
}